

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O1

QString * __thiscall
Win32MakefileGenerator::escapeFilePath
          (QString *__return_storage_ptr__,Win32MakefileGenerator *this,QString *path)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  QString *pQVar4;
  char16_t *pcVar5;
  long in_FS_OFFSET;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]> local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = (path->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (path->d).ptr;
  (__return_storage_ptr__->d).size = (path->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar2 = (QArrayData *)(__return_storage_ptr__->d).size;
  if (pQVar2 == (QArrayData *)0x0) goto LAB_0025cabc;
  local_48.d.ptr = (__return_storage_ptr__->d).ptr;
  local_48.d.d = (Data *)pQVar2;
  qVar3 = QStringView::indexOf((QStringView *)&local_48,(QChar)0x20,0,CaseSensitive);
  if (qVar3 == -1) {
    local_48.d.ptr = (__return_storage_ptr__->d).ptr;
    local_48.d.d = (Data *)(__return_storage_ptr__->d).size;
    qVar3 = QStringView::indexOf((QStringView *)&local_48,(QChar)0x9,0,CaseSensitive);
    if (qVar3 != -1) goto LAB_0025c9ae;
  }
  else {
LAB_0025c9ae:
    local_60.a.a = (char (*) [2])0x2b1745;
    local_60.b = (char (*) [2])0x2b1745;
    local_60.a.b = __return_storage_ptr__;
    QStringBuilder<QStringBuilder<const_char_(&)[2],_QString_&>,_const_char_(&)[2]>::
    convertTo<QString>(&local_48,&local_60);
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar5 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_48.d.d;
    (__return_storage_ptr__->d).ptr = local_48.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_48.d.size;
    local_48.d.d = (Data *)pQVar2;
    local_48.d.ptr = pcVar5;
    local_48.d.size = qVar3;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if (Option::debug_level != 0) {
    QString::toLatin1_helper((QString *)&local_48);
    pcVar5 = local_48.d.ptr;
    if (local_48.d.ptr == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&local_60);
    pQVar4 = local_60.a.b;
    if (local_60.a.b == (QString *)0x0) {
      pQVar4 = (QString *)&QByteArray::_empty;
    }
    debug_msg_internal(2,"EscapeFilePath: %s -> %s",pcVar5,pQVar4);
    if ((QArrayData *)local_60.a.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)*local_60.a.a)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_60.a.a,1,0x10);
      }
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
LAB_0025cabc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString Win32MakefileGenerator::escapeFilePath(const QString &path) const
{
    QString ret = path;
    if(!ret.isEmpty()) {
        if (ret.contains(' ') || ret.contains('\t'))
            ret = "\"" + ret + "\"";
        debug_msg(2, "EscapeFilePath: %s -> %s", path.toLatin1().constData(), ret.toLatin1().constData());
    }
    return ret;
}